

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall higan::EventLoopThreadPool::Start(EventLoopThreadPool *this)

{
  undefined8 uVar1;
  EventLoopThread *this_00;
  reference this_01;
  pointer this_02;
  EventLoop *local_3b0;
  undefined1 local_3a1;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  EventLoopThread *local_340;
  int local_338;
  int i;
  Fmt local_328;
  Logger local_228;
  EventLoopThreadPool *local_10;
  EventLoopThreadPool *this_local;
  
  local_10 = this;
  if ((this->running_ & 1U) != 0) {
    Logger::Logger(&local_228,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoopThreadPool.cpp"
                   ,0x1e,"Start");
    uVar1 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_328,"EventLoopThreadPool %s is running",uVar1);
    Logger::operator<<(&local_228,&local_328);
    Logger::~Logger(&local_228);
  }
  this->running_ = true;
  for (local_338 = 0; local_338 < this->thread_num_; local_338 = local_338 + 1) {
    this_00 = (EventLoopThread *)operator_new(0x150);
    local_3a1 = 1;
    std::operator+(&local_380,&this->name_,"@thread-");
    std::__cxx11::to_string(&local_3a0,local_338);
    std::operator+(&local_360,&local_380,&local_3a0);
    EventLoopThread::EventLoopThread(this_00,&local_360);
    local_3a1 = 0;
    local_340 = this_00;
    std::
    vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
    ::emplace_back<higan::EventLoopThread*>
              ((vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
                *)&this->threads_,&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    this_01 = std::
              vector<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>,_std::allocator<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>_>_>
              ::operator[](&this->threads_,(long)local_338);
    this_02 = std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>
              ::operator->(this_01);
    local_3b0 = EventLoopThread::GetEventLoop(this_02);
    std::vector<higan::EventLoop_*,_std::allocator<higan::EventLoop_*>_>::push_back
              (&this->event_loops_,&local_3b0);
  }
  return;
}

Assistant:

void EventLoopThreadPool::Start()
{
	if (running_)
	{
		LOG_FATAL << higan::Fmt("EventLoopThreadPool %s is running", name_.c_str());
	}

	running_ = true;

	for (int i = 0; i < thread_num_; ++i)
	{
		threads_.emplace_back(new EventLoopThread(name_ + "@thread-" + std::to_string(i)));
		event_loops_.push_back(threads_[i]->GetEventLoop());
	}
}